

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O0

ProxyConfig * ProxyConfig::getInstance(void)

{
  ProxyConfig *this;
  
  if (instance == (ProxyConfig *)0x0) {
    this = (ProxyConfig *)operator_new(0x68);
    ProxyConfig(this);
    instance = this;
  }
  return instance;
}

Assistant:

ProxyConfig* ProxyConfig::getInstance()
{
	if(instance == NULL)
	{
		instance = new ProxyConfig();
	}
	return instance;
}